

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osEvent.cpp
# Opt level: O2

void osEvent::dump_info(ostream *out)

{
  long lVar1;
  osThread *this;
  long lVar2;
  ostream *poVar3;
  char *pcVar4;
  long lVar5;
  
  std::operator<<(out,"Event                         |Thread Name         |State\n");
  std::operator<<(out,"------------------------------+--------------------+------------\n");
  for (lVar5 = 0; lVar5 != 0xa0; lVar5 = lVar5 + 8) {
    lVar1 = *(long *)((long)InstanceList + lVar5);
    if (lVar1 != 0) {
      this = *(osThread **)(lVar1 + 0xb0);
      lVar2 = *(long *)out;
      *(undefined8 *)(out + *(long *)(lVar2 + -0x18) + 0x10) = 0x1e;
      lVar2 = *(long *)(lVar2 + -0x18);
      *(uint *)(out + lVar2 + 0x18) = *(uint *)(out + lVar2 + 0x18) & 0xffffff4f | 0x20;
      poVar3 = std::operator<<(out,(char *)(lVar1 + 0x59));
      *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 0;
      std::operator<<(poVar3,"|");
      lVar1 = *(long *)out;
      *(undefined8 *)(out + *(long *)(lVar1 + -0x18) + 0x10) = 0x14;
      lVar1 = *(long *)(lVar1 + -0x18);
      *(uint *)(out + lVar1 + 0x18) = *(uint *)(out + lVar1 + 0x18) & 0xffffff4f | 0x20;
      if (this == (osThread *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = osThread::GetName(this);
      }
      poVar3 = std::operator<<(out,pcVar4);
      *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 0;
      std::operator<<(poVar3,"|");
      lVar1 = *(long *)out;
      *(undefined8 *)(out + *(long *)(lVar1 + -0x18) + 0x10) = 10;
      lVar1 = *(long *)(lVar1 + -0x18);
      *(uint *)(out + lVar1 + 0x18) = *(uint *)(out + lVar1 + 0x18) & 0xffffff4f | 0x20;
      poVar3 = std::operator<<(out,"");
      *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 0;
      std::operator<<(poVar3,"\n");
    }
  }
  return;
}

Assistant:

void osEvent::dump_info(std::ostream& out)
{
    uint32_t i;

    out << "Event                         |Thread Name         |State\n";
    out << "------------------------------+--------------------+------------\n";
    for (i = 0; i < INSTANCE_MAX; i++)
    {
        osEvent* e = InstanceList[i];
        if (e)
        {
            osThread* thread = e->pending;
            out << std::setw(30) << std::left << e->GetName() << std::setw(0) << "|";
            if (thread)
            {
                out << std::setw(20) << std::left << thread->GetName() << std::setw(0) << "|";
                out << std::setw(10) << std::left << "" << std::setw(0) << "\n";
            }
            else
            {
                out << std::setw(20) << std::left << "" << std::setw(0) << "|";
                out << std::setw(10) << std::left << "" << std::setw(0) << "\n";
            }
        }
    }
}